

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

string * __thiscall
CService::ToStringAddrPort_abi_cxx11_(string *__return_storage_ptr__,CService *this)

{
  Network NVar1;
  long lVar2;
  string *this_00;
  long in_FS_OFFSET;
  string sStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string port_str;
  
  this_00 = &sStack_98;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<unsigned_short>(&port_str,"%u",&this->port);
  NVar1 = (this->super_CNetAddr).m_net;
  if ((NVar1 < NET_MAX) && ((0x5aU >> (NVar1 & 0x1f) & 1) != 0)) {
    CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&this->super_CNetAddr);
    std::operator+(&local_58,&local_78,":");
    std::operator+(__return_storage_ptr__,&local_58,&port_str);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_78;
  }
  else {
    CNetAddr::ToStringAddr_abi_cxx11_(&sStack_98,&this->super_CNetAddr);
    std::operator+(&local_78,"[",&sStack_98);
    std::operator+(&local_58,&local_78,"]:");
    std::operator+(__return_storage_ptr__,&local_58,&port_str);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&port_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CService::ToStringAddrPort() const
{
    const auto port_str = strprintf("%u", port);

    if (IsIPv4() || IsTor() || IsI2P() || IsInternal()) {
        return ToStringAddr() + ":" + port_str;
    } else {
        return "[" + ToStringAddr() + "]:" + port_str;
    }
}